

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON * phosg::JSON::parse(JSON *__return_storage_ptr__,char *s,size_t size,bool disable_extensions)

{
  bool bVar1;
  parse_error *this;
  allocator<char> local_91;
  string local_90;
  undefined1 local_59;
  undefined1 local_58 [8];
  StringReader r;
  bool disable_extensions_local;
  size_t size_local;
  char *s_local;
  JSON *ret;
  
  r.offset._7_1_ = disable_extensions;
  StringReader::StringReader((StringReader *)local_58,s,size,0);
  local_59 = 0;
  parse(__return_storage_ptr__,(StringReader *)local_58,(bool)(r.offset._7_1_ & 1));
  skip_whitespace_and_comments((StringReader *)local_58,(bool)(r.offset._7_1_ & 1));
  bVar1 = StringReader::eof((StringReader *)local_58);
  if (bVar1) {
    local_59 = 1;
    StringReader::~StringReader((StringReader *)local_58);
    return __return_storage_ptr__;
  }
  this = (parse_error *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"unparsed data remains after value",&local_91);
  parse_error::parse_error(this,&local_90);
  __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

JSON JSON::parse(const char* s, size_t size, bool disable_extensions) {
  StringReader r(s, size);
  auto ret = JSON::parse(r, disable_extensions);
  skip_whitespace_and_comments(r, disable_extensions);
  if (!r.eof()) {
    throw parse_error("unparsed data remains after value");
  }
  return ret;
}